

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitfoot.h
# Opt level: O3

void __thiscall
bitfoot::Bitfoot::AddMove<false,(bitfoot::MoveType)5>
          (Bitfoot *this,int piece,int from,int to,int score,int cap,int promo)

{
  int32_t *piVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  
  lVar3 = (long)this->moveCount;
  if (0x7e < lVar3) {
    __assert_fail("(moveCount + 1) < MaxMoves",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa78,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                 );
  }
  if (0x3f < (uint)from) {
    __assert_fail("IS_SQUARE(from)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7a,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                 );
  }
  if (0x3f < (uint)to) {
    __assert_fail("IS_SQUARE(to)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7b,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                 );
  }
  if (0xb < piece - 2U) {
    __assert_fail("IS_PIECE(piece)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7c,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                 );
  }
  if ((piece & 1U) != 0) {
    __assert_fail("COLOR_OF(piece) == color",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7d,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                 );
  }
  if ((&_board)[(uint)from] != piece) {
    __assert_fail("_board[from] == piece",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7e,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                 );
  }
  uVar4 = -score;
  if (0 < score) {
    uVar4 = score;
  }
  if (31999 < uVar4) {
    __assert_fail("abs(score) < Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa7f,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                 );
  }
  if (9 < cap - 2U && cap != 0) {
    __assert_fail("!cap || ((cap >= Pawn) && (cap < King))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xa80,
                  "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                 );
  }
  if ((cap & 1U) != 0 || cap == 0) {
    if ((7 < promo - 4U) && (promo != 0)) {
      __assert_fail("!promo || ((promo >= Knight) && (promo < King))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0xa82,
                    "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                   );
    }
    if ((promo & 1U) != 0) {
      __assert_fail("!promo || (COLOR_OF(promo) == color)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                    ,0xa83,
                    "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                   );
    }
    this->moveCount = this->moveCount + 1;
    if ((uint)piece < 0xc) {
      Move::Init(this->moves + lVar3,EnPassant,from,to,piece,cap,promo,
                 (score + *(int *)(_PIECE_SQR + (ulong)(uint)to * 4 + (ulong)(uint)piece * 0x100)) -
                 *(int *)(_PIECE_SQR + (ulong)(uint)from * 4 + (ulong)(uint)piece * 0x100));
      uVar4 = this->moves[lVar3].bits;
      if ((uVar4 & 0xff00000) == 0) {
        iVar2 = 0x32;
        if (((uVar4 == 0) || (uVar4 != this->killer[0].bits)) &&
           ((uVar4 == 0 || (uVar4 != this->killer[1].bits)))) {
          iVar2 = (int)(char)_hist[uVar4 >> 4 & 0xffff];
          if (iVar2 < -2) {
            __assert_fail("_hist[move.GetHistoryIndex()] >= -2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                          ,0xa90,
                          "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                         );
          }
          if ('(' < (char)_hist[uVar4 >> 4 & 0xffff]) {
            __assert_fail("_hist[move.GetHistoryIndex()] <= 40",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                          ,0xa91,
                          "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
                         );
          }
        }
        piVar1 = &this->moves[lVar3].score;
        *piVar1 = *piVar1 + iVar2;
      }
      return;
    }
    __assert_fail("piece < King",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                  ,0xf9,"int bitfoot::Bitfoot::SquareValue(const int, const int) const");
  }
  __assert_fail("!cap || (COLOR_OF(cap) != color)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Bitfoot/src/Bitfoot.h"
                ,0xa81,
                "void bitfoot::Bitfoot::AddMove(const int, const int, const int, const int, const int, const int) [color = false, type = bitfoot::EnPassant]"
               );
}

Assistant:

inline void AddMove(const int piece,
                      const int from,
                      const int to,
                      const int score,
                      const int cap,
                      const int promo)
  {
    assert((moveCount + 1) < MaxMoves);
    assert(IS_MOVE_TYPE(type));
    assert(IS_SQUARE(from));
    assert(IS_SQUARE(to));
    assert(IS_PIECE(piece));
    assert(COLOR_OF(piece) == color);
    assert(_board[from] == piece);
    assert(abs(score) < Infinity);
    assert(!cap || ((cap >= Pawn) && (cap < King)));
    assert(!cap || (COLOR_OF(cap) != color));
    assert(!promo || ((promo >= Knight) && (promo < King)));
    assert(!promo || (COLOR_OF(promo) == color));

    Move& move = moves[moveCount++];
    move.Init(type, from, to, piece, cap, promo,
              (score + ((type < KingMove)
                        ? (SquareValue(piece, to) - SquareValue(piece, from))
                        : 0)));

    if (!move.IsCapOrPromo()) {
      if (IsKiller(move)) {
        move.Score() += 50;
      }
      else {
        assert(_hist[move.GetHistoryIndex()] >= -2);
        assert(_hist[move.GetHistoryIndex()] <= 40);
        move.Score() += _hist[move.GetHistoryIndex()];
      }
    }
  }